

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kerning.cpp
# Opt level: O3

vector<unsigned_short,_std::allocator<unsigned_short>_> *
dpfb::readCovarageTable
          (vector<unsigned_short,_std::allocator<unsigned_short>_> *__return_storage_ptr__,
          Stream *stream)

{
  iterator iVar1;
  ushort uVar2;
  int iVar3;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *extraout_RAX;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *pvVar4;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *extraout_RAX_00;
  undefined4 extraout_var;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *extraout_RAX_01;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *extraout_RAX_02;
  runtime_error *prVar5;
  ushort uVar6;
  unsigned_short uVar7;
  uint uVar8;
  uint16_t value;
  ushort local_5a;
  string local_58;
  uint local_34;
  
  (__return_storage_ptr__->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*stream->_vptr_Stream[5])(stream,&local_58,2);
  uVar2 = (ushort)local_58._M_dataplus._M_p << 8 | (ushort)local_58._M_dataplus._M_p >> 8;
  if (uVar2 == 2) {
    iVar3 = (*stream->_vptr_Stream[5])(stream,&local_58,2);
    pvVar4 = (vector<unsigned_short,_std::allocator<unsigned_short>_> *)CONCAT44(extraout_var,iVar3)
    ;
    if ((ushort)local_58._M_dataplus._M_p != 0) {
      uVar8 = (uint)(ushort)((ushort)local_58._M_dataplus._M_p << 8 |
                            (ushort)local_58._M_dataplus._M_p >> 8);
      do {
        (*stream->_vptr_Stream[5])(stream,&local_58,2);
        uVar2 = (ushort)local_58._M_dataplus._M_p;
        local_34 = uVar8;
        (*stream->_vptr_Stream[5])(stream,&local_58,2);
        uVar6 = (ushort)local_58._M_dataplus._M_p;
        (*stream->_vptr_Stream[7])(stream,2,1);
        uVar7 = uVar2 << 8 | uVar2 >> 8;
        uVar2 = uVar6 << 8 | uVar6 >> 8;
        if (uVar2 < uVar7) {
          prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
          str::format_abi_cxx11_
                    (&local_58,"Coverage table format 2 range start id (%u) > end id (%u)",
                     (ulong)uVar7,(ulong)uVar2);
          std::runtime_error::runtime_error(prVar5,(string *)&local_58);
          *(undefined ***)prVar5 = &PTR__runtime_error_001277e0;
          __cxa_throw(prVar5,&streams::StreamError::typeinfo,std::runtime_error::~runtime_error);
        }
        std::vector<unsigned_short,_std::allocator<unsigned_short>_>::reserve
                  (__return_storage_ptr__,
                   ((ulong)uVar2 - (ulong)uVar7) +
                   ((long)(__return_storage_ptr__->
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)(__return_storage_ptr__->
                          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                          _M_impl.super__Vector_impl_data._M_start >> 1) + 1);
        uVar8 = local_34 - 1;
        pvVar4 = extraout_RAX_01;
        do {
          iVar1._M_current =
               (__return_storage_ptr__->
               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          local_58._M_dataplus._M_p._0_2_ = uVar7;
          if (iVar1._M_current ==
              (__return_storage_ptr__->
              super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_short,std::allocator<unsigned_short>>::
            _M_realloc_insert<unsigned_short_const&>
                      ((vector<unsigned_short,std::allocator<unsigned_short>> *)
                       __return_storage_ptr__,iVar1,(unsigned_short *)&local_58);
            pvVar4 = extraout_RAX_02;
          }
          else {
            *iVar1._M_current = uVar7;
            (__return_storage_ptr__->
            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
            super__Vector_impl_data._M_finish = iVar1._M_current + 1;
          }
          uVar7 = (ushort)local_58._M_dataplus._M_p + 1;
        } while (uVar7 <= uVar2);
        local_58._M_dataplus._M_p._0_2_ = uVar7;
      } while ((short)uVar8 != 0);
    }
  }
  else {
    if (uVar2 != 1) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      str::format_abi_cxx11_(&local_58,"Unknown format of coverage table: %u",(ulong)(uint)uVar2);
      std::runtime_error::runtime_error(prVar5,(string *)&local_58);
      *(undefined ***)prVar5 = &PTR__runtime_error_001277e0;
      __cxa_throw(prVar5,&streams::StreamError::typeinfo,std::runtime_error::~runtime_error);
    }
    (*stream->_vptr_Stream[5])(stream,&local_58,2);
    uVar2 = (ushort)local_58._M_dataplus._M_p;
    uVar6 = (ushort)local_58._M_dataplus._M_p << 8 | (ushort)local_58._M_dataplus._M_p >> 8;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::reserve
              (__return_storage_ptr__,(ulong)uVar6);
    pvVar4 = extraout_RAX;
    if (uVar2 != 0) {
      do {
        (*stream->_vptr_Stream[5])(stream,&local_58,2);
        local_5a = (ushort)local_58._M_dataplus._M_p << 8 | (ushort)local_58._M_dataplus._M_p >> 8;
        pvVar4 = (vector<unsigned_short,_std::allocator<unsigned_short>_> *)(ulong)local_5a;
        iVar1._M_current =
             (__return_storage_ptr__->
             super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_short,_std::allocator<unsigned_short>_>::
          _M_realloc_insert<unsigned_short>(__return_storage_ptr__,iVar1,&local_5a);
          pvVar4 = extraout_RAX_00;
        }
        else {
          *iVar1._M_current = local_5a;
          (__return_storage_ptr__->
          super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        uVar6 = uVar6 - 1;
      } while (uVar6 != 0);
    }
  }
  return pvVar4;
}

Assistant:

static std::vector<std::uint16_t> readCovarageTable(Stream& stream)
{
    std::vector<std::uint16_t> result;

    const auto coverageFormat = stream.readU16Be();
    if (coverageFormat == 1) {
        auto glyphCount = stream.readU16Be();
        result.reserve(glyphCount);
        while (glyphCount--)
            result.push_back(stream.readU16Be());
    } else if (coverageFormat == 2) {
        auto rangeCount = stream.readU16Be();
        while (rangeCount--) {
            const auto startGlyphId = stream.readU16Be();
            const auto endGlyphId = stream.readU16Be();
            // Skip startCoverageIndex
            stream.seek(
                sizeof(std::uint16_t), SeekOrigin::cur);

            if (startGlyphId > endGlyphId)
                throw StreamError(str::format(
                    "Coverage table format 2 range start id "
                    "(%" PRIu16 ") > end id (%" PRIu16 ")",
                    startGlyphId,
                    endGlyphId));

            result.reserve(
                result.size() + endGlyphId - startGlyphId + 1);
            for (auto i = startGlyphId; i <= endGlyphId; ++ i)
                result.push_back(i);
        }
    } else
        throw StreamError(str::format(
            "Unknown format of coverage table: %" PRIu16,
            coverageFormat));

    return result;
}